

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

shared_ptr<ixy::Mempool> __thiscall
ixy::Mempool::allocate(Mempool *this,uint32_t num_entries,uint32_t entry_size)

{
  LogData<ixy::Pair<ixy::None,_const_char_*>_> begin;
  uint buf_size;
  uint32_t num_entries_00;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *value;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ixy::Mempool> sVar1;
  undefined8 in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  _Map_pointer base_addr;
  uint local_16c;
  ulong local_158;
  uintptr_t local_150;
  uintptr_t addr;
  uint32_t i;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  undefined1 local_d0 [8];
  Mempool pool;
  dma_memory mem;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>_> local_30;
  uint local_18;
  uint32_t local_14;
  uint32_t entry_size_local;
  uint32_t num_entries_local;
  
  local_16c = entry_size;
  if (entry_size == 0) {
    local_16c = 0x800;
  }
  local_18 = local_16c;
  local_14 = num_entries;
  _entry_size_local = this;
  if ((int)(0x200000 % (ulong)local_16c) != 0) {
    memset((void *)((long)&mem.phy + 7),0,1);
    value = ixy::operator<<("entry size must be a divisor of the huge page size ");
    begin.list.second = in_stack_fffffffffffffe80;
    begin.list._0_8_ = in_stack_fffffffffffffe78;
    ixy::operator<<(&local_30,begin,(uint *)value);
    error<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/mempool.cpp"
               ,0x10,"allocate",&local_30);
  }
  join_0x00000010_0x00000000_ = memory_allocate_dma((ulong)(local_14 * local_18),false);
  num_entries_00 = local_14;
  buf_size = local_18;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  base_addr = pool.free_stack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_e8);
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)
             &local_138);
  Mempool((Mempool *)local_d0,(uint8_t *)base_addr,buf_size,num_entries_00,&local_e8,&local_138);
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
            (&local_138);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_e8);
  for (addr._0_4_ = 0; (uint)addr < local_14; addr._0_4_ = (uint)addr + 1) {
    local_150 = virt_to_phys((void *)((long)pool.free_stack.c.
                                            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node +
                                     (ulong)((uint)addr * local_18)));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pool.buf_size,&local_150);
    local_158 = (ulong)(uint)addr;
    std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &pool.physical_addr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_158);
  }
  std::make_shared<ixy::Mempool,ixy::Mempool>(this);
  ~Mempool((Mempool *)local_d0);
  sVar1.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<ixy::Mempool>)
         sVar1.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto Mempool::allocate(uint32_t num_entries, uint32_t entry_size) -> std::shared_ptr<Mempool> {
    entry_size = entry_size ? entry_size : 2048;
    // require entries that neatly fit into the page size, this makes the memory pool much easier
    // otherwise our base_addr + index * size formula would be wrong because we can't cross a page-boundary
    if (HUGE_PAGE_SIZE % entry_size) {
        error("entry size must be a divisor of the huge page size " << HUGE_PAGE_SIZE);
    }

    struct dma_memory mem = memory_allocate_dma(num_entries * entry_size, false);
    auto pool = Mempool{static_cast<uint8_t *>(mem.virt), entry_size, num_entries, std::vector<uint64_t>(),
                        std::stack<uint64_t>()};

    for (uint32_t i = 0; i < num_entries; i++) {
        auto addr = virt_to_phys(static_cast<uint8_t *>(mem.virt) + (i * entry_size));
        pool.physical_addr.push_back(addr);
        pool.free_stack.push(i);
    }

    return std::make_shared<Mempool>(std::move(pool));
}